

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::CoreSamplerTypeCase::getInfos
          (vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
           *__return_storage_ptr__,CoreSamplerTypeCase *this)

{
  long lVar1;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar1 = 0;
  do {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BaseTypeCase::TestTypeInfo>_>
    ::push_back(__return_storage_ptr__,
                (value_type *)((long)&getInfos::samplerTypes[0].glType + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BaseTypeCase::TestTypeInfo> CoreSamplerTypeCase::getInfos (void) const
{
	static const TestTypeInfo samplerTypes[] =
	{
		{ GL_SAMPLER_2D_MULTISAMPLE,				"uniform highp sampler2DMS u_sampler",	"texelFetch(u_sampler, ivec2(gl_FragCoord.xy), 0)" },
		{ GL_INT_SAMPLER_2D_MULTISAMPLE,			"uniform highp isampler2DMS u_sampler",	"texelFetch(u_sampler, ivec2(gl_FragCoord.xy), 0)" },
		{ GL_UNSIGNED_INT_SAMPLER_2D_MULTISAMPLE,	"uniform highp usampler2DMS u_sampler",	"texelFetch(u_sampler, ivec2(gl_FragCoord.xy), 0)" },
	};

	std::vector<TestTypeInfo> infos;
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(samplerTypes); ++ndx)
		infos.push_back(samplerTypes[ndx]);

	return infos;
}